

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_search.c
# Opt level: O0

int is_interp_filter_good_match(INTERPOLATION_FILTER_STATS *st,MB_MODE_INFO *mi,int skip_level)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int in_EDX;
  MB_MODE_INFO *in_RSI;
  long in_RDI;
  int mv_diff;
  int i;
  int is_comp;
  int local_28;
  int local_24;
  
  iVar1 = has_second_ref(in_RSI);
  for (local_24 = 0; local_24 < iVar1 + 1; local_24 = local_24 + 1) {
    if (*(char *)(in_RDI + 0xc + (long)local_24) != in_RSI->ref_frame[local_24]) {
      return 0x7fffffff;
    }
  }
  if ((in_EDX == 1) && (iVar1 != 0)) {
    if (*(COMPOUND_TYPE *)(in_RDI + 0xe) != (in_RSI->interinter_comp).type) {
      return 0x7fffffff;
    }
    if (*(uint *)(in_RDI + 0x10) !=
        (uint)((byte)((ushort)*(undefined2 *)&in_RSI->field_0xa7 >> 9) & 1)) {
      return 0x7fffffff;
    }
  }
  local_28 = 0;
  for (local_24 = 0; local_24 < iVar1 + 1; local_24 = local_24 + 1) {
    iVar2 = (int)*(short *)(in_RDI + 4 + (long)local_24 * 4) - (int)in_RSI->mv[local_24].as_mv.row;
    if (iVar2 < 1) {
      iVar2 = -iVar2;
    }
    iVar3 = (int)*(short *)(in_RDI + 6 + (long)local_24 * 4) -
            (int)*(short *)((long)in_RSI->mv + (long)local_24 * 4 + 2);
    if (iVar3 < 1) {
      iVar3 = -iVar3;
    }
    local_28 = iVar2 + iVar3 + local_28;
  }
  return local_28;
}

Assistant:

static inline int is_interp_filter_good_match(
    const INTERPOLATION_FILTER_STATS *st, MB_MODE_INFO *const mi,
    int skip_level) {
  const int is_comp = has_second_ref(mi);
  int i;

  for (i = 0; i < 1 + is_comp; ++i) {
    if (st->ref_frames[i] != mi->ref_frame[i]) return INT_MAX;
  }

  if (skip_level == 1 && is_comp) {
    if (st->comp_type != mi->interinter_comp.type) return INT_MAX;
    if (st->compound_idx != mi->compound_idx) return INT_MAX;
  }

  int mv_diff = 0;
  for (i = 0; i < 1 + is_comp; ++i) {
    mv_diff += abs(st->mv[i].as_mv.row - mi->mv[i].as_mv.row) +
               abs(st->mv[i].as_mv.col - mi->mv[i].as_mv.col);
  }
  return mv_diff;
}